

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusmenuadaptor.cpp
# Opt level: O1

bool __thiscall QDBusMenuAdaptor::AboutToShow(QDBusMenuAdaptor *this,int id)

{
  QLoggingCategory *pQVar1;
  QDBusPlatformMenuItem *pQVar2;
  QPlatformMenu *this_00;
  long in_FS_OFFSET;
  int in_stack_ffffffffffffffbc;
  QDebug local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = QtPrivateLogging::qLcMenu();
  if (((pQVar1->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
    in_stack_ffffffffffffffbc = 0;
    QMessageLogger::debug();
    QTextStream::operator<<(&(local_28.stream)->ts,id);
    if ((local_28.stream)->space == true) {
      QTextStream::operator<<(&(local_28.stream)->ts,' ');
    }
    QDebug::~QDebug(&local_28);
  }
  if (id == 0) {
    this_00 = *(QPlatformMenu **)(this + 0x10);
  }
  else {
    pQVar2 = QDBusPlatformMenuItem::byId(in_stack_ffffffffffffffbc);
    if ((pQVar2 == (QDBusPlatformMenuItem *)0x0) ||
       (this_00 = pQVar2->m_subMenu, this_00 == (QPlatformMenu *)0x0)) goto LAB_0063f27e;
  }
  QPlatformMenu::aboutToShow(this_00);
LAB_0063f27e:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return false;
}

Assistant:

bool QDBusMenuAdaptor::AboutToShow(int id)
{
    qCDebug(qLcMenu) << id;
    if (id == 0) {
        emit m_topLevelMenu->aboutToShow();
    } else {
        QDBusPlatformMenuItem *item = QDBusPlatformMenuItem::byId(id);
        if (item) {
            const QDBusPlatformMenu *menu = static_cast<const QDBusPlatformMenu *>(item->menu());
            if (menu)
                emit const_cast<QDBusPlatformMenu *>(menu)->aboutToShow();
        }
    }
    return false;  // updateNeeded (we don't know that, so false)
}